

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O1

int aes_ctr_update(archive_crypto_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t *out_len)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar4 = ctx->encr_pos;
  if (*out_len < in_len) {
    in_len = *out_len;
  }
  uVar7 = 0;
  uVar8 = (uint)in_len;
  if (uVar8 != 0) {
    do {
      if (uVar4 == 0x10) {
        lVar3 = 0x34;
        do {
          puVar1 = ctx->key + lVar3 + -0x10;
          *puVar1 = *puVar1 + '\x01';
          if (*puVar1 != '\0') break;
          bVar9 = lVar3 != 0x3b;
          lVar3 = lVar3 + 1;
        } while (bVar9);
        iVar2 = aes_ctr_encrypt_counter(ctx);
        while( true ) {
          if (iVar2 != 0) {
            return -1;
          }
          uVar6 = (uint)uVar7;
          if (uVar8 - uVar6 < 0x10) break;
          lVar3 = 0;
          do {
            uVar4 = uVar6 + (int)lVar3;
            out[uVar4] = ctx->encr_buf[lVar3] ^ in[uVar4];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x10);
          lVar3 = 0x34;
          do {
            puVar1 = ctx->key + lVar3 + -0x10;
            *puVar1 = *puVar1 + '\x01';
            if (*puVar1 != '\0') break;
            bVar9 = lVar3 != 0x3b;
            lVar3 = lVar3 + 1;
          } while (bVar9);
          uVar7 = uVar7 + 0x10;
          iVar2 = aes_ctr_encrypt_counter(ctx);
        }
        uVar4 = 0;
        if (uVar8 <= uVar6) break;
      }
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      out[uVar7 & 0xffffffff] = ctx->encr_buf[uVar5] ^ in[uVar7 & 0xffffffff];
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < uVar8);
    uVar7 = (ulong)uVar6;
  }
  ctx->encr_pos = uVar4;
  *out_len = uVar7;
  return 0;
}

Assistant:

static int
aes_ctr_update(archive_crypto_ctx *ctx, const uint8_t * const in,
    size_t in_len, uint8_t * const out, size_t *out_len)
{
	uint8_t *const ebuf = ctx->encr_buf;
	unsigned pos = ctx->encr_pos;
	unsigned max = (unsigned)((in_len < *out_len)? in_len: *out_len);
	unsigned i;

	for (i = 0; i < max; ) {
		if (pos == AES_BLOCK_SIZE) {
			aes_ctr_increase_counter(ctx);
			if (aes_ctr_encrypt_counter(ctx) != 0)
				return -1;
			while (max -i >= AES_BLOCK_SIZE) {
				for (pos = 0; pos < AES_BLOCK_SIZE; pos++)
					out[i+pos] = in[i+pos] ^ ebuf[pos];
				i += AES_BLOCK_SIZE;
				aes_ctr_increase_counter(ctx);
				if (aes_ctr_encrypt_counter(ctx) != 0)
					return -1;
			}
			pos = 0;
			if (i >= max)
				break;
		}
		out[i] = in[i] ^ ebuf[pos++];
		i++;
	}
	ctx->encr_pos = pos;
	*out_len = i;

	return 0;
}